

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
cinatra::to_chunked_buffers
          (cinatra *this,vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,
          string *size_str,string_view chunk_data,bool eof)

{
  pointer pcVar1;
  __integer_to_chars_result_type<unsigned_long> _Var2;
  const_buffer local_38;
  
  if (size_str != (string *)0x0) {
    detail::resize<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffers,0x14);
    pcVar1 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start;
    _Var2 = std::__to_chars_i<unsigned_long>
                      ((char *)pcVar1,(char *)((long)&pcVar1[1].data_ + 4),(unsigned_long)size_str,
                       0x10);
    pcVar1 = (buffers->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_38.size_ = (long)_Var2.ptr - (long)pcVar1;
    local_38.data_ = (pointer)0x0;
    if (local_38.size_ != 0) {
      local_38.data_ = pcVar1;
    }
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
    local_38.data_ = CRCF_abi_cxx11_;
    local_38.size_ = DAT_00300dc8;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
    local_38.data_ = (void *)chunk_data._M_len;
    local_38.size_ = (size_t)size_str;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
    local_38.data_ = CRCF_abi_cxx11_;
    local_38.size_ = DAT_00300dc8;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
  }
  if ((char)chunk_data._M_str != '\0') {
    local_38.data_ = "0\r\n";
    local_38.size_ = 3;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
    local_38.data_ = CRCF_abi_cxx11_;
    local_38.size_ = DAT_00300dc8;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)this,&local_38);
  }
  return;
}

Assistant:

inline void to_chunked_buffers(std::vector<asio::const_buffer> &buffers,
                               std::string &size_str,
                               std::string_view chunk_data, bool eof) {
  size_t length = chunk_data.size();
  if (length > 0) {
    // convert bytes transferred count to a hex string.
    detail::resize(size_str, 20);
    auto [ptr, ec] =
        std::to_chars(size_str.data(), size_str.data() + 20, length, 16);
    std::string_view chunk_size{size_str.data(),
                                size_t(std::distance(size_str.data(), ptr))};

    // Construct chunk based on rfc2616 section 3.6.1
    buffers.push_back(asio::buffer(chunk_size));
    buffers.push_back(asio::buffer(CRCF));
    buffers.push_back(asio::buffer(chunk_data, length));
    buffers.push_back(asio::buffer(CRCF));
  }

  // append last-chunk
  if (eof) {
    buffers.push_back(asio::buffer(LAST_CHUNK));
    buffers.push_back(asio::buffer(CRCF));
  }
}